

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::FillColumnPalCommand::Execute(FillColumnPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  long lVar5;
  
  puVar4 = (this->super_PalColumnCommand)._dest;
  iVar2 = DrawerThread::count_for_thread
                    (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                     *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < iVar2) {
    lVar5 = (long)(this->super_PalColumnCommand)._pitch;
    iVar3 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    puVar4 = puVar4 + iVar3 * lVar5;
    iVar3 = thread->num_cores;
    iVar1 = (this->super_PalColumnCommand)._color;
    do {
      *puVar4 = (uint8_t)iVar1;
      puVar4 = puVar4 + iVar3 * lVar5;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void FillColumnPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;

		count = _count;
		dest = _dest;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		pitch *= thread->num_cores;

		uint8_t color = _color;
		do
		{
			*dest = color;
			dest += pitch;
		} while (--count);
	}